

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,IxMit<(moira::Mode)10,_4> wrapper)

{
  uint uVar1;
  char *str;
  u16 size;
  u16 is;
  u16 bs;
  u16 scale;
  u16 lw;
  u16 reg;
  anon_class_16_2_f84c6168 outerDisplacement;
  anon_class_16_2_5155fd46 baseRegister;
  u32 outer;
  u32 base;
  anon_class_24_3_79b1865b baseDisplacement;
  anon_class_40_5_76b1e68d indexRegister;
  ushort local_94;
  ushort local_92;
  ushort local_90;
  ushort local_8e;
  ushort local_8c;
  u16 local_8a;
  anon_class_16_2_f84c6168 local_88;
  anon_class_16_2_5155fd46 local_78;
  u32 local_68;
  u32 local_64;
  anon_class_24_3_79b1865b local_60;
  anon_class_40_5_76b1e68d local_48;
  
  uVar1 = (wrapper.ea)->ext1;
  if ((uVar1 >> 8 & 1) == 0) {
    operator<<(this);
    operator<<(this,"@(");
    operator<<(this,(Int)(int)(char)uVar1);
    operator<<(this,",");
    operator<<(this,(Rn)(uVar1 >> 0xc & 0xf));
    str = ":l";
    if ((uVar1 >> 0xb & 1) == 0) {
      str = ":w";
    }
    operator<<(this,str);
    operator<<(this,(Scale)(uVar1 >> 9 & 3));
  }
  else {
    local_48.reg = &local_8a;
    local_8a = (u16)((uVar1 & 0xffff) >> 0xc);
    local_8c = (ushort)(uVar1 >> 0xb) & 1;
    local_48.lw = &local_8c;
    local_8e = (ushort)(uVar1 >> 9) & 3;
    local_48.scale = &local_8e;
    local_90 = (ushort)(uVar1 >> 7) & 1;
    local_78.bs = &local_90;
    local_92 = (ushort)(uVar1 >> 6) & 1;
    local_48.is = &local_92;
    local_94 = (ushort)(uVar1 >> 4) & 3;
    local_60.size = &local_94;
    local_64 = (wrapper.ea)->ext2;
    local_60.base = &local_64;
    local_68 = (wrapper.ea)->ext3;
    local_88.outer = &local_68;
    local_88.this = this;
    local_78.this = this;
    local_60.this = this;
    local_48.this = this;
    if ((uVar1 & 7) == 0) {
      operator<<<(moira::Mode)10,_4>::anon_class_16_2_5155fd46::operator()(&local_78);
      operator<<(this,"@(");
      operator<<<(moira::Mode)10,_4>::anon_class_24_3_79b1865b::operator()(&local_60);
    }
    else {
      operator<<<(moira::Mode)10,_4>::anon_class_16_2_5155fd46::operator()(&local_78);
      operator<<(this,"@(");
      operator<<<(moira::Mode)10,_4>::anon_class_24_3_79b1865b::operator()(&local_60);
      if ((uVar1 & 4) == 0) {
        operator<<<(moira::Mode)10,_4>::anon_class_40_5_76b1e68d::operator()(&local_48);
        operator<<(this,")@(");
        operator<<<(moira::Mode)10,_4>::anon_class_16_2_f84c6168::operator()(&local_88);
        goto LAB_0021d552;
      }
      operator<<(this,")@(");
      operator<<<(moira::Mode)10,_4>::anon_class_16_2_f84c6168::operator()(&local_88);
    }
    operator<<<(moira::Mode)10,_4>::anon_class_40_5_76b1e68d::operator()(&local_48);
  }
LAB_0021d552:
  operator<<(this,")");
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(IxMit<M, S> wrapper)
{
    assert(M == Mode(6) || M == Mode(10));

    auto &ea = wrapper.ea;

    u16 full = _______x________ (ea.ext1);

    if (!full) {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 0  | DISPLACEMENT                         |
        // --------------------------------------------------------------------

        u16 reg   = xxxx____________ (ea.ext1);
        u16 lw    = ____x___________ (ea.ext1);
        u16 scale = _____xx_________ (ea.ext1);
        u16 disp  = ________xxxxxxxx (ea.ext1);

        M == Mode(10) ? *this << Pc{} : *this << An{ea.reg};
        *this << "@(" << Int{(i8)disp};
        *this << "," << Rn{reg} << (lw ? ":l" : ":w") << Scale{scale} << ")";

    } else {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 1  | BS | IS | BD SIZE  | 0  | IIS        |
        // --------------------------------------------------------------------

        u16  reg   = xxxx____________ (ea.ext1);
        u16  lw    = ____x___________ (ea.ext1);
        u16  scale = _____xx_________ (ea.ext1);
        u16  bs    = ________x_______ (ea.ext1);
        u16  is    = _________x______ (ea.ext1);
        u16  size  = __________xx____ (ea.ext1);
        u16  iis   = _____________xxx (ea.ext1);
        u32  base  = ea.ext2;
        u32  outer = ea.ext3;

        auto baseDisplacement = [&]() {
            size == 3 ? (*this << Int{(i32)base}) : (*this << Int{(i16)base});
        };
        auto baseRegister = [&]() {
            if constexpr (M == Mode(10)) {
                bs ? *this << Zpc{} : *this << Pc{};
            } else {
                if (!bs) *this << An{ea.reg};
            }
        };
        auto indexRegister = [&]() {
            if (!is) *this << Sep{} << Rn{reg} << (lw ? ":l" : ":w") << Scale{scale};
        };
        auto outerDisplacement = [&]() {
            *this << Int(outer);
        };

        if (iis == 0) {

            // Memory Indirect Unindexed
            baseRegister();
            *this << "@(";
            baseDisplacement(); indexRegister();
            *this << ")";

        } else if (iis & 0b100) {

            // Memory Indirect Postindexed
            baseRegister();
            *this << "@(";
            baseDisplacement();
            *this << ")@(";
            outerDisplacement(); indexRegister();
            *this << ")";

        } else {

            // Memory Indirect Preindexed
            baseRegister();
            *this << "@(";
            baseDisplacement(); indexRegister();
            *this << ")@(";
            outerDisplacement();
            *this << ")";
        }
    }

    return *this;
}